

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::containerStart(JSONReactor *this)

{
  bool bVar1;
  QPDFObjectHandle local_20;
  JSONReactor *local_10;
  JSONReactor *this_local;
  
  local_10 = this;
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(&(this->next_obj).super_BaseHandle);
  if (bVar1) {
    std::vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>::
    emplace_back<QPDF::JSONReactor::state_e&,QPDFObjectHandle>
              ((vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>
                *)&this->stack,&this->next_state,&this->next_obj);
    memset(&local_20,0,0x10);
    QPDFObjectHandle::QPDFObjectHandle(&local_20);
    QPDFObjectHandle::operator=(&this->next_obj,&local_20);
    QPDFObjectHandle::~QPDFObjectHandle(&local_20);
  }
  else {
    std::vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>::
    emplace_back<QPDF::JSONReactor::state_e&>
              ((vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>
                *)&this->stack,&this->next_state);
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::containerStart()
{
    if (next_obj) {
        stack.emplace_back(next_state, std::move(next_obj));
        next_obj = QPDFObjectHandle();
    } else {
        stack.emplace_back(next_state);
    }
}